

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O1

void __thiscall
tchecker::system::locs_t::add_location
          (locs_t *this,process_id_t pid,string *name,attributes_t *attributes)

{
  pointer psVar1;
  bool bVar2;
  loc_t *this_00;
  ulong uVar3;
  runtime_error *this_01;
  loc_id_t id;
  ulong uVar4;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar5;
  loc_shared_ptr_t loc;
  shared_ptr<tchecker::system::loc_t> local_60;
  string local_50;
  
  id = (loc_id_t)
       ((ulong)((long)(this->_locs).
                      super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_locs).
                     super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  bVar2 = valid_loc_id(id);
  if (!bVar2) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"add_location: invalid location identifier");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (loc_t *)operator_new(0x60);
  loc_t::loc_t(this_00,pid,id,name,attributes);
  local_60.super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::system::loc_t*>
            (&local_60.super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  uVar4 = (ulong)pid;
  uVar3 = ((long)(this->_locs_index).
                 super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_locs_index).
                 super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    std::
    vector<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::resize(&this->_locs_index,(ulong)(pid + 1));
  }
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>
  ::add((this->_locs_index).
        super__Vector_base<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + uVar4,name,&local_60);
  uVar3 = ((long)(this->_process_locs).
                 super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_process_locs).
                 super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    std::
    vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
    ::resize(&this->_process_locs,(ulong)(pid + 1));
  }
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back((this->_process_locs).
              super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar4,&local_60);
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back(&this->_locs,&local_60);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"initial","");
  rVar5 = attributes_t::range(attributes,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((const_iterator)
      rVar5._begin.super_const_iterator.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
      ._M_cur !=
      (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
       )rVar5._end.super_const_iterator.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
        ._M_cur) {
    uVar3 = ((long)(this->_initial_locs).
                   super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_initial_locs).
                   super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
      std::
      vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
      ::resize(&this->_initial_locs,(ulong)(pid + 1));
    }
    std::
    vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
    ::push_back((this->_initial_locs).
                super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar4,&local_60);
  }
  psVar1 = (this->_locs).
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)psVar1 -
       (long)(this->_locs).
             super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U ==
      (ulong)(psVar1[-1].super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_id) {
    if (local_60.super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  __assert_fail("_locs.back()->id() == _locs.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/loc.cc"
                ,0x5c,
                "void tchecker::system::locs_t::add_location(tchecker::process_id_t, const std::string &, const tchecker::system::attributes_t &)"
               );
}

Assistant:

void locs_t::add_location(tchecker::process_id_t pid, std::string const & name,
                          tchecker::system::attributes_t const & attributes)
{
  tchecker::loc_id_t id = _locs.size();

  if (!tchecker::valid_loc_id(id))
    throw std::runtime_error("add_location: invalid location identifier");

  tchecker::system::loc_shared_ptr_t loc(new tchecker::system::loc_t(pid, id, name, attributes));

  if (pid >= _locs_index.size())
    _locs_index.resize(pid + 1);
  _locs_index[pid].add(name, loc); // may throw

  if (pid >= _process_locs.size())
    _process_locs.resize(pid + 1);
  _process_locs[pid].push_back(loc);

  _locs.push_back(loc);

  auto range = attributes.range("initial");
  if (range.begin() != range.end()) {
    if (pid >= _initial_locs.size())
      _initial_locs.resize(pid + 1);
    _initial_locs[pid].push_back(loc);
  }

  assert(_locs.back()->id() == _locs.size() - 1);
}